

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

int __thiscall
libtorrent::aux::session_impl::listen_port(session_impl *this,transport ssl,address *param_2)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  __normal_iterator<const_std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
  _Var4;
  long lVar5;
  __normal_iterator<const_std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
  __it;
  transport local_49;
  shared_ptr<libtorrent::aux::listen_socket_t> *local_48;
  transport *local_40;
  address *local_38;
  
  local_40 = &local_49;
  __it._M_current =
       (this->m_listen_sockets).
       super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48 = (this->m_listen_sockets).
             super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)local_48 - (long)__it._M_current;
  local_49 = ssl;
  local_38 = param_2;
  for (lVar3 = lVar5 >> 6; _Var4._M_current = __it._M_current, 0 < lVar3; lVar3 = lVar3 + -1) {
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::aux::session_impl::listen_port(libtorrent::aux::transport,boost::asio::ip::address_const&)const::$_0>
            ::operator()((_Iter_pred<libtorrent::aux::session_impl::listen_port(libtorrent::aux::transport,boost::asio::ip::address_const&)const::__0>
                          *)&local_40,__it);
    if (bVar1) goto LAB_00296076;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::aux::session_impl::listen_port(libtorrent::aux::transport,boost::asio::ip::address_const&)const::$_0>
            ::operator()((_Iter_pred<libtorrent::aux::session_impl::listen_port(libtorrent::aux::transport,boost::asio::ip::address_const&)const::__0>
                          *)&local_40,__it._M_current + 1);
    _Var4._M_current = __it._M_current + 1;
    if (bVar1) goto LAB_00296076;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::aux::session_impl::listen_port(libtorrent::aux::transport,boost::asio::ip::address_const&)const::$_0>
            ::operator()((_Iter_pred<libtorrent::aux::session_impl::listen_port(libtorrent::aux::transport,boost::asio::ip::address_const&)const::__0>
                          *)&local_40,__it._M_current + 2);
    _Var4._M_current = __it._M_current + 2;
    if (bVar1) goto LAB_00296076;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::aux::session_impl::listen_port(libtorrent::aux::transport,boost::asio::ip::address_const&)const::$_0>
            ::operator()((_Iter_pred<libtorrent::aux::session_impl::listen_port(libtorrent::aux::transport,boost::asio::ip::address_const&)const::__0>
                          *)&local_40,__it._M_current + 3);
    _Var4._M_current = __it._M_current + 3;
    if (bVar1) goto LAB_00296076;
    __it._M_current = __it._M_current + 4;
    lVar5 = lVar5 + -0x40;
  }
  lVar5 = lVar5 >> 4;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      _Var4._M_current = local_48;
      if ((lVar5 != 3) ||
         (bVar1 = __gnu_cxx::__ops::
                  _Iter_pred<libtorrent::aux::session_impl::listen_port(libtorrent::aux::transport,boost::asio::ip::address_const&)const::$_0>
                  ::operator()((_Iter_pred<libtorrent::aux::session_impl::listen_port(libtorrent::aux::transport,boost::asio::ip::address_const&)const::__0>
                                *)&local_40,__it), _Var4._M_current = __it._M_current, bVar1))
      goto LAB_00296076;
      _Var4._M_current = __it._M_current + 1;
    }
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::aux::session_impl::listen_port(libtorrent::aux::transport,boost::asio::ip::address_const&)const::$_0>
            ::operator()((_Iter_pred<libtorrent::aux::session_impl::listen_port(libtorrent::aux::transport,boost::asio::ip::address_const&)const::__0>
                          *)&local_40,_Var4);
    if (bVar1) goto LAB_00296076;
    __it._M_current = _Var4._M_current + 1;
  }
  bVar1 = __gnu_cxx::__ops::
          _Iter_pred<libtorrent::aux::session_impl::listen_port(libtorrent::aux::transport,boost::asio::ip::address_const&)const::$_0>
          ::operator()((_Iter_pred<libtorrent::aux::session_impl::listen_port(libtorrent::aux::transport,boost::asio::ip::address_const&)const::__0>
                        *)&local_40,__it);
  _Var4._M_current = local_48;
  if (bVar1) {
    _Var4._M_current = __it._M_current;
  }
LAB_00296076:
  if (_Var4._M_current ==
      (this->m_listen_sockets).
      super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar2 = 0;
  }
  else {
    iVar2 = listen_socket_t::tcp_external_port
                      (((_Var4._M_current)->
                       super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr);
  }
  return iVar2;
}

Assistant:

int session_impl::listen_port(transport const ssl, address const& local_addr) const
	{
		auto socket = std::find_if(m_listen_sockets.begin(), m_listen_sockets.end()
			, [&](std::shared_ptr<listen_socket_t> const& e)
		{
			if (!(e->flags & listen_socket_t::accept_incoming)) return false;
			auto const& listen_addr = e->external_address.external_address();
			return e->ssl == ssl
				&& (listen_addr == local_addr
					|| (listen_addr.is_v4() == local_addr.is_v4() && listen_addr.is_unspecified()));
		});
		if (socket != m_listen_sockets.end())
			return (*socket)->tcp_external_port();
		return 0;
	}